

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::~SAT(SAT *this)

{
  uint uVar1;
  uint uVar2;
  Clause **ppCVar3;
  undefined8 *in_RDI;
  uint i_1;
  uint i;
  uint local_10;
  uint local_c;
  
  *in_RDI = &PTR_finished_0031f868;
  local_c = 0;
  while( true ) {
    uVar1 = vec<Clause_*>::size((vec<Clause_*> *)(in_RDI + 2));
    if (uVar1 <= local_c) break;
    ppCVar3 = vec<Clause_*>::operator[]((vec<Clause_*> *)(in_RDI + 2),local_c);
    free(*ppCVar3);
    local_c = local_c + 1;
  }
  local_10 = 0;
  while( true ) {
    uVar1 = local_10;
    uVar2 = vec<Clause_*>::size((vec<Clause_*> *)(in_RDI + 4));
    if (uVar2 <= uVar1) break;
    ppCVar3 = vec<Clause_*>::operator[]((vec<Clause_*> *)(in_RDI + 4),local_10);
    free(*ppCVar3);
    local_10 = local_10 + 1;
  }
  vec<double>::~vec((vec<double> *)CONCAT44(uVar2,uVar1));
  vec<bool>::~vec((vec<bool> *)CONCAT44(uVar2,uVar1));
  Heap<SAT::VarOrderLt>::~Heap((Heap<SAT::VarOrderLt> *)CONCAT44(uVar2,uVar1));
  vec<double>::~vec((vec<double> *)CONCAT44(uVar2,uVar1));
  vec<IntVar_*>::~vec((vec<IntVar_*> *)CONCAT44(uVar2,uVar1));
  vec<Lit>::~vec((vec<Lit> *)CONCAT44(uVar2,uVar1));
  vec<Lit>::~vec((vec<Lit> *)CONCAT44(uVar2,uVar1));
  vec<int>::~vec((vec<int> *)CONCAT44(uVar2,uVar1));
  vec<bool>::~vec((vec<bool> *)CONCAT44(uVar2,uVar1));
  vec<char>::~vec((vec<char> *)CONCAT44(uVar2,uVar1));
  vec<int>::~vec((vec<int> *)CONCAT44(uVar2,uVar1));
  vec<Lit>::~vec((vec<Lit> *)CONCAT44(uVar2,uVar1));
  vec<vec<Clause_*>_>::~vec((vec<vec<Clause_*>_> *)CONCAT44(uVar2,uVar1));
  vec<int>::~vec((vec<int> *)CONCAT44(uVar2,uVar1));
  vec<vec<Lit>_>::~vec((vec<vec<Lit>_> *)CONCAT44(uVar2,uVar1));
  vec<int>::~vec((vec<int> *)CONCAT44(uVar2,uVar1));
  vec<int>::~vec((vec<int> *)CONCAT44(uVar2,uVar1));
  vec<LitFlags>::~vec((vec<LitFlags> *)CONCAT44(uVar2,uVar1));
  vec<int>::~vec((vec<int> *)CONCAT44(uVar2,uVar1));
  vec<Reason>::~vec((vec<Reason> *)CONCAT44(uVar2,uVar1));
  vec<signed_char>::~vec((vec<signed_char> *)CONCAT44(uVar2,uVar1));
  vec<vec<WatchElem>_>::~vec((vec<vec<WatchElem>_> *)CONCAT44(uVar2,uVar1));
  vec<ChannelInfo>::~vec((vec<ChannelInfo> *)CONCAT44(uVar2,uVar1));
  vec<Clause_*>::~vec((vec<Clause_*> *)CONCAT44(uVar2,uVar1));
  vec<Clause_*>::~vec((vec<Clause_*> *)CONCAT44(uVar2,uVar1));
  return;
}

Assistant:

SAT::~SAT() {
	for (unsigned int i = 0; i < clauses.size(); i++) {
		free(clauses[i]);
	}
	for (unsigned int i = 0; i < learnts.size(); i++) {
		free(learnts[i]);
	}
}